

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a)

{
  reference pvVar1;
  long in_RDI;
  result_type_conflict rVar2;
  int64_t i;
  uniform_real_distribution<double> uniform;
  minstd_rand rng;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined8 local_30;
  
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (result_type)in_stack_ffffffffffffffb8);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (double)in_stack_ffffffffffffffb8,7.4416711048819e-318);
  for (local_30 = 0; (long)local_30 < *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
      local_30 = local_30 + 1) {
    rVar2 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc4 = (float)rVar2;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),local_30);
    *pvVar1 = in_stack_ffffffffffffffc4;
  }
  return;
}

Assistant:

void DenseMatrix::uniform(real a) {
  std::minstd_rand rng(1);
  std::uniform_real_distribution<> uniform(-a, a);
  for (int64_t i = 0; i < (m_ * n_); i++) {
    data_[i] = uniform(rng);
  }
}